

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

int build_grammar(Grammar *g)

{
  byte *pbVar1;
  VecAction *v;
  Action **ppAVar2;
  uint uVar3;
  AssocKind AVar4;
  Elem **ppEVar5;
  Declaration *pDVar6;
  Term *pTVar7;
  State *pSVar8;
  Action **ppAVar9;
  Action *pAVar10;
  Item *pIVar11;
  int iVar12;
  ElemKind EVar13;
  uint uVar14;
  Production *pPVar15;
  Elem *pEVar16;
  Rule *pRVar17;
  Production *pPVar18;
  State *pSVar19;
  ulong uVar20;
  ulong uVar21;
  Action **ppAVar22;
  uint i_2;
  ulong uVar23;
  ulong uVar24;
  char *pcVar25;
  uint uVar26;
  byte bVar27;
  uint i;
  ulong uVar28;
  Production **ppPVar29;
  uint i_1;
  Term *pTVar30;
  State *pSVar31;
  bool bVar32;
  bool bVar33;
  Production *local_168;
  char str [256];
  
  g->rule_index = 0;
  for (uVar23 = 0; uVar21 = (ulong)(g->productions).n, uVar23 < uVar21; uVar23 = uVar23 + 1) {
    pPVar18 = (g->productions).v[uVar23];
    pPVar15 = lookup_production(g,pPVar18->name,pPVar18->name_len);
    if (pPVar18 != pPVar15) {
      d_fail("duplicate production \'%s\'");
    }
    pPVar18->index = (uint)uVar23;
    for (uVar21 = 0; uVar21 < (pPVar18->rules).n; uVar21 = uVar21 + 1) {
      pRVar17 = (pPVar18->rules).v[uVar21];
      uVar14 = g->rule_index;
      g->rule_index = uVar14 + 1;
      pRVar17->index = uVar14;
      local_168 = (Production *)0x0;
      for (uVar20 = 0; uVar3 = (pRVar17->elems).n, uVar20 < uVar3; uVar20 = uVar20 + 1) {
        pEVar16 = (pRVar17->elems).v[uVar20];
        pEVar16->index = (uint)uVar20;
        EVar13 = pEVar16->kind;
        if (EVar13 == ELEM_UNRESOLVED) {
          uVar3 = (pEVar16->e).unresolved.len;
          uVar24 = (ulong)uVar3;
          pcVar25 = (pEVar16->e).unresolved.string;
          pPVar15 = lookup_production(g,pcVar25,uVar3);
          if (pPVar15 == (Production *)0x0) {
            uVar26 = (g->terminals).n;
            for (uVar28 = 0; uVar26 != uVar28; uVar28 = uVar28 + 1) {
              pPVar15 = (Production *)(g->terminals).v[uVar28];
              if (((*(int *)&pPVar15->name == 3) && (*(uint *)((pPVar15->rules).e + 1) == uVar3)) &&
                 (iVar12 = strncmp((char *)(pPVar15->rules).e[0],pcVar25,(long)(int)uVar3),
                 iVar12 == 0)) {
                free(pcVar25);
                pEVar16->kind = ELEM_TERM;
                (pEVar16->e).term = (Term *)pPVar15;
                local_168 = pPVar15;
                goto LAB_0013c8b0;
              }
            }
            strncpy(str,pcVar25,uVar24);
            if (0xfe < uVar3) {
              uVar24 = 0xff;
            }
            str[uVar24] = '\0';
            d_fail("unresolved identifier: \'%s\'");
            EVar13 = pEVar16->kind;
            goto LAB_0013c8a2;
          }
          free(pcVar25);
          pEVar16->kind = ELEM_NTERM;
          (pEVar16->e).nterm = pPVar15;
        }
        else {
LAB_0013c8a2:
          if (EVar13 == ELEM_TERM) {
            local_168 = (pEVar16->e).nterm;
          }
        }
LAB_0013c8b0:
      }
      pRVar17->end->index = uVar3;
      if (((g->set_op_priority_from_rule != 0) && (local_168 != (Production *)0x0)) &&
         (pRVar17->rule_assoc != ASSOC_NONE)) {
        *(AssocKind *)&(local_168->rules).v = pRVar17->rule_assoc;
        *(int *)((long)&(local_168->rules).v + 4) = pRVar17->rule_priority;
      }
    }
  }
  uVar3 = (g->terminals).n;
  for (uVar23 = 0; uVar3 != uVar23; uVar23 = uVar23 + 1) {
    (g->terminals).v[uVar23]->index = (uint)uVar23;
  }
  for (uVar23 = 0; uVar23 != uVar21; uVar23 = uVar23 + 1) {
    pPVar18 = (g->productions).v[uVar23];
    uVar20 = 0;
    do {
      if ((pPVar18->rules).n == uVar20) goto LAB_0013c972;
      pRVar17 = (pPVar18->rules).v[uVar20];
      uVar20 = uVar20 + 1;
    } while ((pRVar17->elems).n != 0);
    pPVar18->nullable = pRVar17;
LAB_0013c972:
  }
  bVar32 = true;
  while (bVar32) {
    bVar32 = false;
    for (uVar23 = 0; uVar23 != uVar21; uVar23 = uVar23 + 1) {
      pPVar18 = (g->productions).v[uVar23];
      if ((pPVar18->nullable == (Rule *)0x0) && ((pPVar18->rules).n != 0)) {
        pRVar17 = *(pPVar18->rules).v;
        uVar20 = 0;
        while ((pRVar17->elems).n != uVar20) {
          pEVar16 = (pRVar17->elems).v[uVar20];
          if ((pEVar16->kind != ELEM_NTERM) ||
             (uVar20 = uVar20 + 1, ((pEVar16->e).nterm)->nullable == (Rule *)0x0))
          goto LAB_0013c9d9;
        }
        pPVar18->nullable = pRVar17;
        bVar32 = true;
      }
LAB_0013c9d9:
    }
  }
  for (uVar23 = 0; uVar23 < uVar21; uVar23 = uVar23 + 1) {
    pPVar18 = (g->productions).v[uVar23];
    if ((pPVar18->field_0x3c & 1) != 0) {
      convert_regex_production_one(g,pPVar18);
      uVar21 = (ulong)(g->productions).n;
    }
  }
  for (uVar23 = 0; uVar23 < uVar21; uVar23 = uVar23 + 1) {
    pPVar18 = (g->productions).v[uVar23];
    for (uVar21 = 0; uVar21 < (pPVar18->rules).n; uVar21 = uVar21 + 1) {
      pRVar17 = (pPVar18->rules).v[uVar21];
      for (uVar20 = 0; uVar20 < (pRVar17->elems).n; uVar20 = uVar20 + 1) {
        pEVar16 = (pRVar17->elems).v[uVar20];
        if ((pEVar16->kind == ELEM_NTERM) &&
           (pPVar15 = (Production *)((pEVar16->e).nterm)->regex_term, pPVar15 != (Production *)0x0))
        {
          (pEVar16->e).nterm = pPVar15;
          (pRVar17->elems).v[uVar20]->kind = ELEM_TERM;
        }
      }
    }
    uVar21 = (ulong)(g->productions).n;
  }
  uVar23 = 0;
  do {
    ppPVar29 = (g->productions).v;
    if (uVar21 <= uVar23) {
      pPVar18 = *ppPVar29;
      if (g->tokenizer != 0) {
        pEVar16 = new_elem_nterm(pPVar18,(Rule *)0x0);
        new_declaration(g,pEVar16,0);
      }
      if (g->longest_match != 0) {
        pEVar16 = new_elem_nterm(*(g->productions).v,(Rule *)0x0);
        new_declaration(g,pEVar16,1);
      }
      for (uVar23 = 0; uVar21 = (ulong)(g->declarations).n, uVar23 < uVar21; uVar23 = uVar23 + 1) {
        pEVar16 = (g->declarations).v[uVar23]->elem;
        if (pEVar16->kind == ELEM_UNRESOLVED) {
          uVar14 = (pEVar16->e).unresolved.len;
          if (uVar14 == 0) {
            pPVar15 = *(g->productions).v;
          }
          else {
            pcVar25 = (pEVar16->e).unresolved.string;
            pPVar15 = lookup_production(g,pcVar25,uVar14);
            if (pPVar15 == (Production *)0x0) {
              d_fail("unresolved declaration \'%s\'",pcVar25);
              pPVar15 = (Production *)0x0;
            }
          }
          free((pEVar16->e).term_or_nterm);
          pEVar16->kind = ELEM_NTERM;
          (pEVar16->e).nterm = pPVar15;
        }
      }
      for (uVar23 = 0; uVar23 < uVar21; uVar23 = uVar23 + 1) {
        pDVar6 = (g->declarations).v[uVar23];
        if (pDVar6->kind < 3) {
          pPVar15 = (pDVar6->elem->e).nterm;
          if (pPVar15 == pPVar18) {
            uVar3 = (g->productions).n;
            for (uVar20 = 0; uVar3 != uVar20; uVar20 = uVar20 + 1) {
              (g->productions).v[uVar20]->declaration_group[(g->declarations).v[uVar23]->kind] =
                   pPVar18;
              pDVar6 = (g->declarations).v[uVar23];
              (g->productions).v[uVar20]->last_declaration[pDVar6->kind] = pDVar6;
            }
          }
          else {
            set_declaration_group(pPVar15,pPVar15,pDVar6);
            uVar21 = (ulong)(g->declarations).n;
          }
        }
      }
      for (uVar23 = 0; uVar21 = (ulong)(g->productions).n, uVar23 < uVar21; uVar23 = uVar23 + 1) {
        pPVar18 = (g->productions).v[uVar23];
        for (uVar21 = 0; uVar21 < (pPVar18->rules).n; uVar21 = uVar21 + 1) {
          pRVar17 = (pPVar18->rules).v[uVar21];
          for (uVar20 = 0; uVar20 < (pRVar17->elems).n; uVar20 = uVar20 + 1) {
            pEVar16 = (pRVar17->elems).v[uVar20];
            if (pEVar16->kind == ELEM_TERM) {
              if (pPVar18->declaration_group[1] == (Production *)0x0) {
                pbVar1 = (byte *)((long)(((pEVar16->e).nterm)->rules).e + 0xc);
                *pbVar1 = *pbVar1 & 0xf8;
              }
              else if (pPVar18->declaration_group[2] == (Production *)0x0) {
                *(byte *)((long)(((pEVar16->e).nterm)->rules).e + 0xc) =
                     (*(byte *)((long)(((pEVar16->e).nterm)->rules).e + 0xc) & 0xf8) + 1;
              }
              else {
                bVar27 = *(byte *)((long)(((pEVar16->e).nterm)->rules).e + 0xc) & 0xf8;
                if (pPVar18->last_declaration[2]->index < pPVar18->last_declaration[1]->index) {
                  bVar27 = bVar27 | 1;
                }
                *(byte *)((long)(((pEVar16->e).nterm)->rules).e + 0xc) = bVar27;
              }
            }
          }
        }
      }
      for (uVar23 = 0; ppPVar29 = (g->productions).v, uVar23 < uVar21; uVar23 = uVar23 + 1) {
        pPVar18 = ppPVar29[uVar23];
        for (uVar21 = 0; uVar21 < (pPVar18->rules).n; uVar21 = uVar21 + 1) {
          pRVar17 = (pPVar18->rules).v[uVar21];
          for (uVar20 = 0; uVar20 < (pRVar17->elems).n; uVar20 = uVar20 + 1) {
            pEVar16 = (pRVar17->elems).v[uVar20];
            if (pEVar16->kind == ELEM_TERM) {
              pTVar7 = (pEVar16->e).term;
              uVar3 = (g->terminals).n;
              uVar24 = 0;
              while ((pTVar30 = pTVar7, uVar3 != uVar24 &&
                     ((((((pTVar30 = (g->terminals).v[uVar24], pTVar7->kind != pTVar30->kind ||
                          (pTVar7->string_len != pTVar30->string_len)) ||
                         (pTVar7->term_priority != pTVar30->term_priority)) ||
                        (pTVar7->term_name != pTVar30->term_name)) ||
                       ((g->set_op_priority_from_rule != 0 &&
                        ((pTVar7->op_assoc != pTVar30->op_assoc ||
                         (pTVar7->op_priority != pTVar30->op_priority)))))) ||
                      (iVar12 = strncmp(pTVar7->string,pTVar30->string,(long)pTVar7->string_len),
                      iVar12 != 0))))) {
                uVar24 = uVar24 + 1;
              }
              (pEVar16->e).term = pTVar30;
            }
          }
        }
        uVar21 = (ulong)(g->productions).n;
      }
      pPVar18 = *ppPVar29;
      for (uVar23 = 0; uVar23 < uVar21; uVar23 = uVar23 + 1) {
        if (((ppPVar29[uVar23]->field_0x3c & 0x1c) == 0) &&
           ((g->states_for_all_nterms != 0 ||
            (uVar14 = state_for_declaration(g,(uint)uVar23), uVar14 != 0)))) {
          for (uVar20 = 0; uVar20 != uVar21; uVar20 = uVar20 + 1) {
            for (uVar24 = 0; uVar24 < (ppPVar29[uVar20]->rules).n; uVar24 = uVar24 + 1) {
              pRVar17 = (ppPVar29[uVar20]->rules).v[uVar24];
              uVar28 = 0;
              do {
                if ((pRVar17->elems).n == uVar28) goto LAB_0013cfb7;
                pEVar16 = (pRVar17->elems).v[uVar28];
                uVar28 = uVar28 + 1;
              } while ((pEVar16->e).nterm != ppPVar29[uVar23]);
              ppPVar29[uVar23]->elem = pEVar16;
LAB_0013cfb7:
            }
          }
          pPVar15 = ppPVar29[uVar23];
          pRVar17 = new_rule(g,pPVar18);
          pEVar16 = new_elem_nterm(pPVar15,pRVar17);
          ppPVar29 = (g->productions).v;
          ppPVar29[uVar23]->elem = pEVar16;
          uVar14 = g->rule_index;
          g->rule_index = uVar14 + 1;
          ppPVar29[uVar23]->elem->rule->index = uVar14;
          uVar21 = (ulong)(g->productions).n;
        }
      }
      if (((g->states_for_all_nterms == 0) && (g->states_for_whitespace != 0)) &&
         (pPVar15 = lookup_production(g,"whitespace",10), pPVar15 != (Production *)0x0)) {
        pRVar17 = new_rule(g,pPVar18);
        pEVar16 = new_elem_nterm(pPVar15,pRVar17);
        pPVar15->elem = pEVar16;
        uVar14 = g->rule_index;
        g->rule_index = uVar14 + 1;
        pEVar16->rule->index = uVar14;
      }
      pPVar18 = lookup_production(g,"_",1);
      if ((pPVar18 != (Production *)0x0) && (1 < (pPVar18->rules).n)) {
        d_fail("number of rules in default action != 1");
      }
      build_LR_tables(g);
      for (uVar23 = 0; uVar21 = (ulong)(g->states).n, uVar23 < uVar21; uVar23 = uVar23 + 1) {
        pSVar31 = (g->states).v[uVar23];
        pSVar31->field_0x178 = pSVar31->field_0x178 & 199 | 0x20;
      }
      uVar23 = 0;
      do {
        if ((g->declarations).n <= uVar23) {
          for (uVar23 = 0; uVar23 < uVar21; uVar23 = uVar23 + 1) {
            pSVar31 = (g->states).v[uVar23];
            bVar27 = pSVar31->field_0x178;
            if ((bVar27 & 0x38) == 0x20) {
              pSVar31->field_0x178 = bVar27 & 199;
              uVar21 = (ulong)(g->states).n;
            }
          }
          if ((d_verbose_level != 0) &&
             (printf("%d productions %d terminals %d states %d declarations\n",
                     (ulong)(g->productions).n,(ulong)(g->terminals).n,uVar21,
                     (ulong)(g->declarations).n), 1 < d_verbose_level)) {
            print_grammar(g);
            print_states(g);
          }
          build_scanners(g);
          build_eq(g);
          return 0;
        }
        pDVar6 = (g->declarations).v[uVar23];
        if (pDVar6->kind < 3) {
          pSVar31 = (State *)0x0;
          for (uVar20 = 0; uVar20 < uVar21; uVar20 = uVar20 + 1) {
            pSVar8 = (g->states).v[uVar20];
            pSVar19 = pSVar31;
            if ((pDVar6->kind == 0) && (pSVar19 = pSVar8, pSVar31 != (State *)0x0)) {
              pSVar8->same_shifts = pSVar31;
              v = &pSVar31->shift_actions;
              ppAVar2 = (pSVar31->shift_actions).e;
              for (uVar21 = 0; pSVar19 = pSVar31, uVar21 < (pSVar8->shift_actions).n;
                  uVar21 = uVar21 + 1) {
                uVar3 = v->n;
                uVar24 = (ulong)uVar3;
                uVar28 = 0;
                do {
                  if (uVar24 == uVar28) {
                    ppAVar9 = (pSVar31->shift_actions).v;
                    if (ppAVar9 == (Action **)0x0) {
                      pAVar10 = (pSVar8->shift_actions).v[uVar21];
                      (pSVar31->shift_actions).v = ppAVar2;
                      (pSVar31->shift_actions).n = uVar3 + 1;
                      (pSVar31->shift_actions).e[uVar24] = pAVar10;
                      break;
                    }
                    if (ppAVar9 == ppAVar2) {
                      ppAVar22 = (pSVar8->shift_actions).v;
                      if (2 < uVar3) goto LAB_0013d1a6;
                    }
                    else {
                      ppAVar22 = (pSVar8->shift_actions).v;
                      if ((uVar3 & 7) == 0) {
LAB_0013d1a6:
                        vec_add_internal(v,ppAVar22[uVar21]);
                        break;
                      }
                    }
                    pAVar10 = ppAVar22[uVar21];
                    v->n = uVar3 + 1;
                    ppAVar9[uVar24] = pAVar10;
                    break;
                  }
                  ppAVar9 = (pSVar31->shift_actions).v + uVar28;
                  uVar28 = uVar28 + 1;
                } while ((pSVar8->shift_actions).v[uVar21]->term != (*ppAVar9)->term);
              }
            }
            uVar3 = (pSVar8->items).n;
            for (uVar21 = 0; uVar3 != uVar21; uVar21 = uVar21 + 1) {
              pIVar11 = (pSVar8->items).v[uVar21];
              if (pIVar11->kind == ELEM_TERM) {
                bVar27 = *(byte *)((long)(((pIVar11->e).nterm)->rules).e + 0xc);
                if ((bVar27 & 7) == 0) {
                  bVar27 = (byte)*(uint *)&pSVar8->field_0x178;
                  if ((*(uint *)&pSVar8->field_0x178 >> 3 & 3) == 0) {
                    bVar27 = bVar27 & 199;
                  }
                  else {
LAB_0013d22f:
                    bVar27 = bVar27 & 199 | 0x10;
                  }
                }
                else {
                  if ((bVar27 & 7) != 1) goto LAB_0013d23e;
                  bVar27 = (byte)*(uint *)&pSVar8->field_0x178;
                  uVar26 = *(uint *)&pSVar8->field_0x178 >> 3 & 7;
                  if ((uVar26 != 4) && (uVar26 != 1)) goto LAB_0013d22f;
                  bVar27 = bVar27 & 199 | 8;
                }
                pSVar8->field_0x178 = bVar27;
              }
LAB_0013d23e:
            }
            uVar21 = (ulong)(g->states).n;
            pSVar31 = pSVar19;
          }
        }
        uVar23 = uVar23 + 1;
      } while( true );
    }
    pPVar18 = ppPVar29[uVar23];
    for (uVar21 = 0; uVar21 < (pPVar18->rules).n; uVar21 = uVar21 + 1) {
      pRVar17 = (pPVar18->rules).v[uVar21];
      uVar3 = (pRVar17->elems).n;
      if (1 < uVar3) {
        ppEVar5 = (pRVar17->elems).v;
        pEVar16 = *ppEVar5;
        if (pEVar16->kind == ELEM_NTERM) {
          bVar32 = (pEVar16->e).nterm == pPVar18;
        }
        else {
          bVar32 = false;
        }
        pEVar16 = ppEVar5[uVar3 - 1];
        if (pEVar16->kind == ELEM_NTERM) {
          bVar33 = (pEVar16->e).nterm == pPVar18;
        }
        else {
          bVar33 = false;
        }
        AVar4 = pRVar17->rule_assoc;
        if ((AVar4 & 3) == ASSOC_NONE || (AVar4 & 4) == ASSOC_NONE) {
          if ((AVar4 & 0x10) == ASSOC_NONE) {
LAB_0013cb0f:
            if ((AVar4 & 8) == ASSOC_NONE) goto LAB_0013cc03;
            if ((AVar4 & 2) == ASSOC_NONE || bVar33) {
              if ((AVar4 & 1) == ASSOC_NONE || bVar32) goto LAB_0013cc03;
              pcVar25 = "left unary rule must have left recursive nterm";
            }
            else {
              pcVar25 = "right unary rule must have right recursive nterm";
            }
          }
          else if ((AVar4 & 2) == ASSOC_NONE || bVar33) {
            if ((AVar4 & 1) == ASSOC_NONE || bVar32) goto LAB_0013cb0f;
            pcVar25 = "left binary rule must have left recursive nterm";
          }
          else {
            pcVar25 = "right binary rule must have right recursive nterm";
          }
          d_fail(pcVar25);
        }
        else if ((bool)(bVar32 & bVar33)) {
          if (AVar4 == ASSOC_NARY_RIGHT) {
            pRVar17->rule_assoc = ASSOC_BINARY_RIGHT;
          }
          else if (AVar4 == ASSOC_NARY_LEFT) {
            pRVar17->rule_assoc = ASSOC_BINARY_LEFT;
          }
        }
        else if (bVar32) {
          if (AVar4 == ASSOC_NARY_RIGHT) {
            d_fail("nary rule with right associativity cannot have left recursive nterm");
          }
          pRVar17->rule_assoc = ASSOC_UNARY_LEFT;
        }
        else if (bVar33) {
          if (AVar4 == ASSOC_NARY_LEFT) {
            d_fail("nary rule with left associativity cannot have right recursive nterm");
          }
          pRVar17->rule_assoc = ASSOC_UNARY_RIGHT;
        }
      }
LAB_0013cc03:
    }
    uVar23 = uVar23 + 1;
    uVar21 = (ulong)(g->productions).n;
  } while( true );
}

Assistant:

int build_grammar(Grammar *g) {
  resolve_grammar(g);
  convert_regex_productions(g);
  convert_priorities(g);
  propogate_declarations(g);
  merge_identical_terminals(g);
  make_elems_for_productions(g);
  check_default_actions(g);
  build_LR_tables(g);
  map_declarations_to_states(g);
  if (d_verbose_level) {
    printf("%d productions %d terminals %d states %d declarations\n", g->productions.n, g->terminals.n, g->states.n,
           g->declarations.n);
  }
  if (d_verbose_level > 1) {
    print_grammar(g);
    print_states(g);
  }
  build_scanners(g);
  build_eq(g);
  return 0;
}